

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-reader.cc
# Opt level: O1

Result __thiscall
wabt::anon_unknown_19::BinaryReader::ReadTable
          (BinaryReader *this,Type *out_elem_type,Limits *out_elem_limits)

{
  Result RVar1;
  char *format;
  Type TVar2;
  uint local_34;
  Type local_30;
  uint32_t initial;
  uint32_t flags;
  uint32_t max;
  
  local_30 = Any;
  RVar1 = ReadS32Leb128(this,(uint32_t *)&local_30,"table elem type");
  if (RVar1.enum_ != Error) {
    *out_elem_type = local_30;
    if (local_30 == Anyfunc) {
      initial = 0;
      RVar1 = ReadU32Leb128(this,(uint32_t *)&local_30,"table flags");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      RVar1 = ReadU32Leb128(this,&local_34,"table initial elem count");
      if (RVar1.enum_ == Error) {
        return (Result)Error;
      }
      if ((local_30 & ~F32) == Any) {
        TVar2 = local_30 & ~I64;
        if (TVar2 != Any) {
          RVar1 = ReadU32Leb128(this,&initial,"table max elem count");
          if (RVar1.enum_ == Error) {
            return (Result)Error;
          }
          if (initial < local_34) {
            format = "table initial elem count must be <= max elem count";
            goto LAB_00f41313;
          }
        }
        out_elem_limits->has_max = SUB41(TVar2,0);
        out_elem_limits->initial = (ulong)local_34;
        out_elem_limits->max = (ulong)initial;
        return (Result)Ok;
      }
      format = "tables may not be shared";
LAB_00f41313:
      PrintError(this,format);
      return (Result)Error;
    }
    PrintError(this,"table elem type must by anyfunc");
  }
  return (Result)Error;
}

Assistant:

Result BinaryReader::ReadTable(Type* out_elem_type, Limits* out_elem_limits) {
  CHECK_RESULT(ReadType(out_elem_type, "table elem type"));
  ERROR_UNLESS(*out_elem_type == Type::Anyfunc,
               "table elem type must by anyfunc");

  uint32_t flags;
  uint32_t initial;
  uint32_t max = 0;
  CHECK_RESULT(ReadU32Leb128(&flags, "table flags"));
  CHECK_RESULT(ReadU32Leb128(&initial, "table initial elem count"));
  bool has_max = flags & WABT_BINARY_LIMITS_HAS_MAX_FLAG;
  bool is_shared = flags & WABT_BINARY_LIMITS_IS_SHARED_FLAG;
  ERROR_UNLESS(!is_shared, "tables may not be shared");
  if (has_max) {
    CHECK_RESULT(ReadU32Leb128(&max, "table max elem count"));
    ERROR_UNLESS(initial <= max,
                 "table initial elem count must be <= max elem count");
  }

  out_elem_limits->has_max = has_max;
  out_elem_limits->initial = initial;
  out_elem_limits->max = max;
  return Result::Ok;
}